

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O2

bool __thiscall
cmFileCommand::HandleReadElfCommand
          (cmFileCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args)

{
  pointer pbVar1;
  bool bVar2;
  int iVar3;
  StringEntry *pSVar4;
  ostream *poVar5;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __begin0;
  pointer pbVar6;
  string *filename;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __end0;
  string_view arg;
  static_string_view name;
  static_string_view name_00;
  static_string_view name_01;
  char local_22a [2];
  string rpath;
  Arguments arguments;
  cmELF elf;
  
  pbVar6 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(args->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar6) < 0x80) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&elf,"READ_ELF must be called with at least three additional arguments.",
               (allocator<char> *)&arguments);
    cmCommand::SetError(&this->super_cmCommand,(string *)&elf);
    std::__cxx11::string::~string((string *)&elf);
    bVar2 = false;
  }
  else {
    if (HandleReadElfCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
        ::parser == '\0') {
      iVar3 = __cxa_guard_acquire(&HandleReadElfCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                                   ::parser);
      if (iVar3 != 0) {
        elf.Internal = (cmELFInternal *)0x0;
        elf.ErrorMessage._M_dataplus._M_p = (pointer)0x0;
        elf.ErrorMessage._M_string_length = 0;
        name.super_string_view._M_str = "RPATH";
        name.super_string_view._M_len = 5;
        cmArgumentParser<cmFileCommand::HandleReadElfCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
        ::Bind<std::__cxx11::string>
                  ((cmArgumentParser<cmFileCommand::HandleReadElfCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
                    *)&elf,name,0);
        name_00.super_string_view._M_str = "RUNPATH";
        name_00.super_string_view._M_len = 7;
        cmArgumentParser<cmFileCommand::HandleReadElfCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
        ::Bind<std::__cxx11::string>
                  ((cmArgumentParser<cmFileCommand::HandleReadElfCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
                    *)&elf,name_00,0x20);
        name_01.super_string_view._M_str = "CAPTURE_ERROR";
        name_01.super_string_view._M_len = 0xd;
        cmArgumentParser<cmFileCommand::HandleReadElfCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
        ::Bind<std::__cxx11::string>
                  ((cmArgumentParser<cmFileCommand::HandleReadElfCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)::Arguments>
                    *)&elf,name_01,0x40);
        std::
        vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
        ::vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
                  *)&HandleReadElfCommand::parser,
                 (vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
                  *)&elf);
        std::
        vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
        ::~vector((vector<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::function<void_(ArgumentParser::Instance_&,_void_*)>_>_>_>
                   *)&elf);
        __cxa_atexit(cmArgumentParser<Arguments>::~cmArgumentParser,&HandleReadElfCommand::parser,
                     &__dso_handle);
        __cxa_guard_release(&HandleReadElfCommand(std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>const&)
                             ::parser);
      }
    }
    pbVar1 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    arguments.RPath._M_dataplus._M_p = (pointer)&arguments.RPath.field_2;
    arguments.RPath._M_string_length = 0;
    filename = pbVar6 + 1;
    arguments.RPath.field_2._M_local_buf[0] = '\0';
    arguments.RunPath._M_dataplus._M_p = (pointer)&arguments.RunPath.field_2;
    arguments.RunPath._M_string_length = 0;
    arguments.RunPath.field_2._M_local_buf[0] = '\0';
    arguments.Error._M_dataplus._M_p = (pointer)&arguments.Error.field_2;
    arguments.Error._M_string_length = 0;
    arguments.Error.field_2._M_local_buf[0] = '\0';
    elf.Internal = (cmELFInternal *)&HandleReadElfCommand::parser;
    elf.ErrorMessage._M_dataplus._M_p = (pointer)0x0;
    elf.ErrorMessage._M_string_length = 0;
    elf.ErrorMessage.field_2._M_local_buf[0] = '\0';
    for (pbVar6 = (args->
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start + 2; pbVar6 != pbVar1;
        pbVar6 = pbVar6 + 1) {
      arg._M_str = (pbVar6->_M_dataplus)._M_p;
      arg._M_len = pbVar6->_M_string_length;
      ArgumentParser::Instance::Consume
                ((Instance *)&elf,arg,&arguments,
                 (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x0,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)0x0);
    }
    bVar2 = cmsys::SystemTools::FileExists(filename,true);
    if (bVar2) {
      cmELF::cmELF(&elf,(filename->_M_dataplus)._M_p);
      if (arguments.RPath._M_string_length != 0) {
        pSVar4 = cmELF::GetRPath(&elf);
        if (pSVar4 != (StringEntry *)0x0) {
          std::__cxx11::string::string((string *)&rpath,(string *)pSVar4);
          local_22a[1] = 0x3a;
          local_22a[0] = ';';
          std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                    ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )rpath._M_dataplus._M_p,
                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(rpath._M_dataplus._M_p + rpath._M_string_length),local_22a + 1,local_22a);
          cmMakefile::AddDefinition
                    ((this->super_cmCommand).Makefile,&arguments.RPath,rpath._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&rpath);
        }
      }
      if (arguments.RunPath._M_string_length != 0) {
        pSVar4 = cmELF::GetRunPath(&elf);
        if (pSVar4 != (StringEntry *)0x0) {
          std::__cxx11::string::string((string *)&rpath,(string *)pSVar4);
          local_22a[1] = 0x3a;
          local_22a[0] = ';';
          std::replace<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
                    ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )rpath._M_dataplus._M_p,
                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(rpath._M_dataplus._M_p + rpath._M_string_length),local_22a + 1,local_22a);
          cmMakefile::AddDefinition
                    ((this->super_cmCommand).Makefile,&arguments.RunPath,rpath._M_dataplus._M_p);
          std::__cxx11::string::~string((string *)&rpath);
        }
      }
      cmELF::~cmELF(&elf);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&elf);
      poVar5 = std::operator<<((ostream *)&elf,"READ_ELF given FILE \"");
      poVar5 = std::operator<<(poVar5,(string *)filename);
      std::operator<<(poVar5,"\" that does not exist.");
      std::__cxx11::stringbuf::str();
      cmCommand::SetError(&this->super_cmCommand,&rpath);
      std::__cxx11::string::~string((string *)&rpath);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&elf);
    }
    HandleReadElfCommand::Arguments::~Arguments(&arguments);
  }
  return bVar2;
}

Assistant:

bool cmFileCommand::HandleReadElfCommand(std::vector<std::string> const& args)
{
  if (args.size() < 4) {
    this->SetError("READ_ELF must be called with at least three additional "
                   "arguments.");
    return false;
  }

  std::string const& fileNameArg = args[1];

  struct Arguments
  {
    std::string RPath;
    std::string RunPath;
    std::string Error;
  };

  static auto const parser = cmArgumentParser<Arguments>{}
                               .Bind("RPATH"_s, &Arguments::RPath)
                               .Bind("RUNPATH"_s, &Arguments::RunPath)
                               .Bind("CAPTURE_ERROR"_s, &Arguments::Error);
  Arguments const arguments = parser.Parse(cmMakeRange(args).advance(2));

  if (!cmSystemTools::FileExists(fileNameArg, true)) {
    std::ostringstream e;
    e << "READ_ELF given FILE \"" << fileNameArg << "\" that does not exist.";
    this->SetError(e.str());
    return false;
  }

#if defined(CMAKE_USE_ELF_PARSER)
  cmELF elf(fileNameArg.c_str());

  if (!arguments.RPath.empty()) {
    if (cmELF::StringEntry const* se_rpath = elf.GetRPath()) {
      std::string rpath(se_rpath->Value);
      std::replace(rpath.begin(), rpath.end(), ':', ';');
      this->Makefile->AddDefinition(arguments.RPath, rpath.c_str());
    }
  }
  if (!arguments.RunPath.empty()) {
    if (cmELF::StringEntry const* se_runpath = elf.GetRunPath()) {
      std::string runpath(se_runpath->Value);
      std::replace(runpath.begin(), runpath.end(), ':', ';');
      this->Makefile->AddDefinition(arguments.RunPath, runpath.c_str());
    }
  }

  return true;
#else
  std::string error = "ELF parser not available on this platform.";
  if (arguments.Error.empty()) {
    this->SetError(error);
    return false;
  }
  this->Makefile->AddDefinition(arguments.Error, error.c_str());
  return true;
#endif
}